

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O2

void __thiscall
RenX::ExemptionDatabase::process_data
          (ExemptionDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
  entry;
  _Head_base<0UL,_RenX::ExemptionDatabase::Entry_*,_false> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::make_unique<RenX::ExemptionDatabase::Entry>();
  ((local_50._M_head_impl)->pos).__pos = pos.__pos;
  ((local_50._M_head_impl)->pos).__state = pos.__state;
  puVar3 = *(uint8_t **)(buffer + 8);
  (local_50._M_head_impl)->flags = *puVar3;
  ((local_50._M_head_impl)->timestamp).__d.__r = *(long *)(puVar3 + 1) * 1000000000;
  ((local_50._M_head_impl)->length).__r = *(rep *)(puVar3 + 9);
  (local_50._M_head_impl)->steamid = *(uint64_t *)(puVar3 + 0x11);
  uVar2 = *(uint32_t *)(puVar3 + 0x19);
  *(uint8_t **)(buffer + 8) = puVar3 + 0x1d;
  (local_50._M_head_impl)->ip = uVar2;
  uVar1 = puVar3[0x1d];
  *(uint8_t **)(buffer + 8) = puVar3 + 0x1e;
  (local_50._M_head_impl)->prefix_length = uVar1;
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
  interpret<char,std::char_traits<char>,std::allocator<char>>
            (&local_48,
             (_Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>
              *)(buffer + 8),(uint8_t **)(ulong)CONCAT31((int3)(uVar2 >> 8),uVar1));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_50._M_head_impl)->setter,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>>
              *)&this->m_entries,
             (unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
              *)&local_50);
  std::
  unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>::
  ~unique_ptr((unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
               *)&local_50);
  return;
}

Assistant:

void RenX::ExemptionDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint8_t>();
	entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
	entry->length = std::chrono::seconds(buffer.pop<int64_t>());
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	entry->setter = buffer.pop<std::string>();

	m_entries.push_back(std::move(entry));
}